

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_parse_angle.cpp
# Opt level: O2

int ON_ParseAngleExpression
              (wchar_t *str,int str_count,ON_ParseSettings parse_settings,
              AngleUnitSystem angle_value_unit_system,double *angle_value,
              ON_ParseSettings *parse_results,AngleUnitSystem *str_angle_unit_system)

{
  int iVar1;
  double dVar2;
  AngleUnitSystem parsed_angle_us;
  double x;
  AngleUnitSystem local_29;
  double local_28;
  
  local_29 = None;
  local_28 = -1.23432101234321e+308;
  iVar1 = ON_ParseAngleExpression(str,str_count,parse_settings,&local_28,parse_results,&local_29);
  if ((((0 < iVar1) && (local_29 != None)) && (angle_value_unit_system != None)) &&
     (local_29 != angle_value_unit_system)) {
    dVar2 = ON::AngleUnitScale(local_29,angle_value_unit_system);
    local_28 = dVar2 * local_28;
  }
  if (str_angle_unit_system != (AngleUnitSystem *)0x0) {
    *str_angle_unit_system = local_29;
  }
  if (angle_value != (double *)0x0) {
    *angle_value = local_28;
  }
  return iVar1;
}

Assistant:

int ON_ParseAngleExpression( 
  const wchar_t* str,
  int str_count,
  ON_ParseSettings parse_settings,
  const ON::AngleUnitSystem angle_value_unit_system,
  double* angle_value,
  ON_ParseSettings* parse_results,
  ON::AngleUnitSystem* str_angle_unit_system
  )
{
  ON::AngleUnitSystem parsed_angle_us = ON::AngleUnitSystem::None;

  double x = ON_UNSET_VALUE;
  int parsed_element_count = ON_ParseAngleExpression(
    str,
    str_count,
    parse_settings,
    &x,
    parse_results,
    &parsed_angle_us
    );

  if ( parsed_element_count > 0 )
  {
    if (    parsed_angle_us != angle_value_unit_system 
         && ON::AngleUnitSystem::None != angle_value_unit_system
         && ON::AngleUnitSystem::None != parsed_angle_us
         )
    {
      double s = ON::AngleUnitScale(parsed_angle_us,angle_value_unit_system);
      x *= s;
    }
  }

  if ( 0 != str_angle_unit_system )
    *str_angle_unit_system = parsed_angle_us;
  if ( 0 != angle_value )
    *angle_value = x;

  return parsed_element_count;
}